

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void prvTidyPPrintTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  int iVar1;
  int iVar2;
  Dict *pDVar3;
  Bool BVar4;
  Bool BVar5;
  Node *node_00;
  uint *node_01;
  Node *pNVar6;
  Node *pNVar7;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  uint extraout_EDX_07;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  uint mode_00;
  uint uVar9;
  bool bVar10;
  
  if (node == (Node *)0x0) {
    return;
  }
  BVar5 = *(Bool *)((doc->config).value + 1);
  iVar1 = *(int *)((doc->config).value + 0x1a);
  if (doc->progressCallback != (TidyPPProgress)0x0) {
    (*doc->progressCallback)((TidyDoc)doc,node->line,node->column,(doc->pprint).line + 1);
  }
  node_01 = &switchD_00136535::switchdataD_00148100;
  switch(node->type) {
  case RootNode:
    for (pNVar7 = node->content; pNVar7 != (Node *)0x0; pNVar7 = pNVar7->next) {
      prvTidyPPrintTree(doc,mode,indent,pNVar7);
    }
    return;
  case DocTypeTag:
    PPrintDocType(doc,indent,node);
    return;
  case CommentTag:
    PPrintComment(doc,indent,node);
    return;
  case ProcInsTag:
    PPrintPI(doc,indent,node);
    return;
  case TextNode:
    PPrintText(doc,mode,indent,node);
    return;
  case CDATATag:
    PPrintCDATA(doc,indent,node);
    return;
  case SectionTag:
    PPrintSection(doc,indent,node);
    return;
  case AspTag:
    PPrintAsp(doc,indent,node);
    return;
  case JsteTag:
    PPrintJste(doc,indent,node);
    return;
  case PhpTag:
    PPrintPhp(doc,indent,node);
    return;
  case XmlDecl:
    PPrintXmlDecl(doc,indent,node);
    return;
  }
  if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_MATHML)) {
    PPrintMathML(doc,indent,node);
    return;
  }
  BVar4 = prvTidynodeCMIsEmpty(node);
  if ((BVar4 != no) || ((node->type == StartEndTag && (iVar1 == 0)))) {
    BVar5 = prvTidynodeHasCM(node,0x10);
    if (BVar5 == no) {
      PCondFlushLineSmart(doc,indent);
    }
    if (((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_BR)) && (node->prev != (Node *)0x0)
       ) {
      pDVar3 = node->prev->tag;
      if (pDVar3 == (Dict *)0x0) {
        if ((mode & 1) == 0) goto LAB_001367d1;
      }
      else if (((mode & 1) == 0) && (pDVar3->id != TidyTag_BR)) {
LAB_001367d1:
        if (*(int *)((doc->config).value + 0x28) != 0) {
          prvTidyPFlushLineSmart(doc,indent);
        }
      }
    }
    if (((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_HR)) &&
       ((*(int *)((doc->config).value + 0x55) == 1 &&
        ((node->parent != (Node *)0x0 && (node->parent->content != node)))))) {
      prvTidyPFlushLineSmart(doc,indent);
    }
    PPrintTag(doc,mode,indent,node);
    if (node->next == (Node *)0x0) {
      return;
    }
    pDVar3 = node->tag;
    if (pDVar3 == (Dict *)0x0) {
      return;
    }
    if (pDVar3->id == TidyTag_PARAM) {
LAB_0013684f:
      PCondFlushLineSmart(doc,indent);
      return;
    }
    if (pDVar3 == (Dict *)0x0) {
      return;
    }
    if (pDVar3->id == TidyTag_AREA) goto LAB_0013684f;
    if (pDVar3 == (Dict *)0x0) {
      return;
    }
    if (((mode & 1) != 0) || (pDVar3->id != TidyTag_BR)) {
      if (pDVar3 == (Dict *)0x0) {
        return;
      }
      if (pDVar3->id != TidyTag_HR) {
        return;
      }
    }
    goto LAB_00136cc1;
  }
  if (node->type == StartEndTag) {
    node->type = StartTag;
  }
  pDVar3 = node->tag;
  mode_00 = (uint)node;
  if (pDVar3 != (Dict *)0x0) {
    node_01 = (uint *)pDVar3->parser;
    if (((code *)node_01 == prvTidyParsePre) || (pDVar3->id == TidyTag_TEXTAREA)) {
      iVar1 = *(int *)((doc->config).value + 0x55);
      PCondFlushLineSmart(doc,indent);
      if ((iVar1 == 1) && ((node->parent != (Node *)0x0 && (node->parent->content != node)))) {
        prvTidyPFlushLineSmart(doc,indent);
      }
      pNVar6 = node;
      PPrintTag(doc,mode,indent,node);
      pNVar7 = node->content;
      uVar9 = extraout_EDX;
      if (pNVar7 != (Node *)0x0) {
        do {
          pNVar6 = pNVar7;
          prvTidyPPrintTree(doc,mode | 9,0,pNVar7);
          pNVar7 = pNVar7->next;
          uVar9 = extraout_EDX_00;
        } while (pNVar7 != (Node *)0x0);
      }
      PPrintEndTag(doc,mode_00,uVar9,pNVar6);
      if (*(int *)((doc->config).value + 0x14) != 0) {
        return;
      }
      if (node->next == (Node *)0x0) {
        return;
      }
      goto LAB_00136cc1;
    }
    if ((pDVar3 != (Dict *)0x0) &&
       ((pDVar3->id == TidyTag_STYLE || ((pDVar3 != (Dict *)0x0 && (pDVar3->id == TidyTag_SCRIPT))))
       )) {
      PPrintScriptStyle(doc,mode | 0x19,indent,node);
      return;
    }
  }
  BVar4 = prvTidynodeCMIsInline(node);
  if (BVar4 != no) {
    if (((*(int *)((doc->config).value + 0x20) != 0) && (node->tag != (Dict *)0x0)) &&
       (node->tag->id == TidyTag_NOBR)) {
      pNVar7 = node->content;
      if (pNVar7 == (Node *)0x0) {
        return;
      }
      do {
        prvTidyPPrintTree(doc,mode | 8,indent,pNVar7);
        pNVar7 = pNVar7->next;
      } while (pNVar7 != (Node *)0x0);
      return;
    }
    pNVar7 = node;
    PPrintTag(doc,mode,indent,node);
    BVar4 = ShouldIndent(doc,node);
    if (BVar4 == no) {
      uVar8 = extraout_RDX;
      for (pNVar6 = node->content; uVar9 = (uint)uVar8, pNVar6 != (Node *)0x0; pNVar6 = pNVar6->next
          ) {
        pNVar7 = pNVar6;
        prvTidyPPrintTree(doc,mode,indent,pNVar6);
        uVar8 = extraout_RDX_00;
      }
    }
    else {
      PCondFlushLineSmart(doc,BVar5 + indent);
      for (pNVar6 = node->content; pNVar6 != (Node *)0x0; pNVar6 = pNVar6->next) {
        pNVar7 = pNVar6;
        prvTidyPPrintTree(doc,mode,BVar5 + indent,pNVar6);
      }
      PCondFlushLineSmart(doc,indent);
      uVar9 = extraout_EDX_01;
    }
    PPrintEndTag(doc,mode_00,uVar9,pNVar7);
    return;
  }
  bVar10 = true;
  if (*(int *)((doc->config).value + 0x17) == 0) {
    bVar10 = *(int *)((doc->config).value + 0x16) != 0;
  }
  iVar1 = *(int *)((doc->config).value + 0x14);
  iVar2 = *(int *)((doc->config).value + 0x55);
  if (((iVar2 == 1) && (node->parent != (Node *)0x0)) &&
     ((node->parent->content != node &&
      ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_HTML)))))) {
    prvTidyPFlushLineSmart(doc,indent);
  }
  BVar4 = ShouldIndent(doc,node);
  if (BVar4 != no) {
    BVar4 = BVar5;
  }
  PCondFlushLineSmart(doc,indent);
  if (((iVar1 == 2) && (iVar2 == 1)) && (node->prev != (Node *)0x0)) {
    prvTidyPFlushLineSmart(doc,indent);
  }
  uVar9 = BVar4 + indent;
  if (((bVar10) && (BVar4 = prvTidynodeHasCM(node,0x200000), BVar4 != no)) &&
     (node->attributes == (AttVal *)0x0)) {
    BVar4 = ShouldIndent(doc,node);
    if (BVar4 == no) {
      BVar5 = no;
    }
    uVar9 = uVar9 - BVar5;
  }
  else {
    node_01 = (uint *)node;
    PPrintTag(doc,mode,indent,node);
    BVar5 = ShouldIndent(doc,node);
    if (BVar5 == no) {
      BVar5 = prvTidynodeHasCM(node,2);
      if (((BVar5 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_NOFRAMES)))) ||
         ((BVar5 = prvTidynodeHasCM(node,4), BVar5 != no &&
          ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_TITLE)))))) {
        prvTidyPFlushLineSmart(doc,uVar9);
      }
    }
    else if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_LI)) ||
            (BVar5 = prvTidynodeIsText(node->content), BVar5 == no)) {
      PCondFlushLineSmart(doc,uVar9);
    }
  }
  if (node->content != (Node *)0x0) {
    pNVar7 = node->content;
    pNVar6 = (Node *)0x0;
    do {
      node_00 = pNVar7;
      if (((pNVar6 != (Node *)0x0 && iVar1 == 0) && (BVar5 = prvTidynodeIsText(pNVar6), BVar5 != no)
          ) && ((node_00->tag != (Dict *)0x0 &&
                (BVar5 = prvTidynodeHasCM(node_00,0x10), BVar5 == no)))) {
        prvTidyPFlushLineSmart(doc,uVar9);
      }
      node_01 = (uint *)node_00;
      prvTidyPPrintTree(doc,mode,uVar9,node_00);
      pNVar7 = node_00->next;
      pNVar6 = node_00;
    } while (node_00->next != (Node *)0x0);
  }
  BVar5 = ShouldIndent(doc,node);
  if (BVar5 == no) {
    if (!bVar10) {
      BVar5 = prvTidynodeHasCM(node,2);
      if (((BVar5 == no) && ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_NOFRAMES)))) &&
         ((BVar5 = prvTidynodeHasCM(node,4), uVar9 = extraout_EDX_06, BVar5 == no ||
          ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TITLE)))))) goto LAB_00136be6;
      goto LAB_00136b9f;
    }
    BVar5 = prvTidynodeHasCM(node,0x8000);
    uVar9 = extraout_EDX_04;
    if (BVar5 == no) {
LAB_00136be6:
      if (iVar2 == 1) {
        for (pNVar7 = node->content; pNVar7 != (Node *)0x0; pNVar7 = pNVar7->next) {
          BVar5 = prvTidynodeIsText(pNVar7);
          uVar9 = extraout_EDX_05;
          if (BVar5 != no) goto LAB_00136c68;
        }
        prvTidyPFlushLineSmart(doc,indent);
        uVar9 = extraout_EDX_07;
      }
      goto LAB_00136c68;
    }
  }
  else {
LAB_00136b9f:
    PCondFlushLineSmart(doc,indent);
    uVar9 = extraout_EDX_02;
    if ((!bVar10) || (BVar5 = prvTidynodeHasCM(node,0x8000), uVar9 = extraout_EDX_03, BVar5 == no))
    {
LAB_00136c68:
      PPrintEndTag(doc,mode_00,uVar9,(Node *)node_01);
    }
  }
  if (iVar1 == 0 && !bVar10) {
    if (node->tag != (Dict *)0x0) {
      if ((iVar2 != 1) && (node->tag->id != TidyTag_HTML)) goto LAB_00136cc1;
      goto LAB_00136c82;
    }
    if (iVar2 != 1) goto LAB_00136cc1;
  }
  else {
LAB_00136c82:
    if (iVar2 != 1) {
      return;
    }
  }
  if ((node->next == (Node *)0x0) || (BVar5 = prvTidynodeHasCM(node,0xe8), BVar5 == no)) {
    return;
  }
LAB_00136cc1:
  prvTidyPFlushLineSmart(doc,indent);
  return;
}

Assistant:

void TY_(PPrintTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Node *content, *last;
    uint spaces = cfg( doc, TidyIndentSpaces );
    Bool xhtml = cfgBool( doc, TidyXhtmlOut );

    if ( node == NULL )
        return;

    if (doc->progressCallback)
    {
        doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
    }

    if (node->type == TextNode)
    {
        PPrintText( doc, mode, indent, node );
    }
    else if ( node->type == CommentTag )
    {
        PPrintComment( doc, indent, node );
    }
    else if ( node->type == RootNode )
    {
        for ( content = node->content; content; content = content->next )
           TY_(PPrintTree)( doc, mode, indent, content );
    }
    else if ( node->type == DocTypeTag )
        PPrintDocType( doc, indent, node );
    else if ( node->type == ProcInsTag)
        PPrintPI( doc, indent, node );
    else if ( node->type == XmlDecl)
        PPrintXmlDecl( doc, indent, node );
    else if ( node->type == CDATATag)
        PPrintCDATA( doc, indent, node );
    else if ( node->type == SectionTag)
        PPrintSection( doc, indent, node );
    else if ( node->type == AspTag)
        PPrintAsp( doc, indent, node );
    else if ( node->type == JsteTag)
        PPrintJste( doc, indent, node );
    else if ( node->type == PhpTag)
        PPrintPhp( doc, indent, node );
    else if ( nodeIsMATHML(node) )
        PPrintMathML( doc, indent, node ); /* #130 MathML attr and entity fix! */
    else if ( TY_(nodeCMIsEmpty)(node) ||
              (node->type == StartEndTag && !xhtml) )
    {
        /* Issue #8 - flush to new line? 
           maybe use if ( TY_(nodeHasCM)(node, CM_BLOCK) ) instead
           or remove the CM_INLINE from the tag
         */
        if ( ! TY_(nodeHasCM)(node, CM_INLINE) )
            PCondFlushLineSmart( doc, indent );

        if ( nodeIsBR(node) && node->prev &&
             !(nodeIsBR(node->prev) || (mode & PREFORMATTED)) &&
             cfgBool(doc, TidyBreakBeforeBR) )
            TY_(PFlushLineSmart)( doc, indent );

        if ( nodeIsHR(node) )
        {
            /* insert extra newline for classic formatting */
            Bool classic = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            if (classic && node->parent && node->parent->content != node)
            {
                TY_(PFlushLineSmart)( doc, indent );
            }
        }

        PPrintTag( doc, mode, indent, node );

        if (node->next)
        {
          if (nodeIsPARAM(node) || nodeIsAREA(node))
              PCondFlushLineSmart(doc, indent);
          else if ((nodeIsBR(node) && !(mode & PREFORMATTED))
                   || nodeIsHR(node))
              TY_(PFlushLineSmart)(doc, indent);
        }
    }
    else /* some kind of container element */
    {
        if ( node->type == StartEndTag )
            node->type = StartTag;

        if ( node->tag && 
             (node->tag->parser == TY_(ParsePre) || nodeIsTEXTAREA(node)) )
        {
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint indprev = indent;

            PCondFlushLineSmart( doc, indent ); /* about to add <pre> tag - clear any previous */

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node)
            {
                TY_(PFlushLineSmart)( doc, indent );
            }

            PPrintTag( doc, mode, indent, node );   /* add <pre> or <textarea> tag */

            indent = 0;
            /* @camoy Fix #158 - remove inserted newlines in pre - TY_(PFlushLineSmart)( doc, indent ); */

            for ( content = node->content; content; content = content->next )
            {
                TY_(PPrintTree)( doc, (mode | PREFORMATTED | NOWRAP),
                                 indent, content );
            }

            /* @camoy Fix #158 - remove inserted newlines in pre - PCondFlushLineSmart( doc, indent ); */
            indent = indprev;
            PPrintEndTag( doc, mode, indent, node );

            if ( cfgAutoBool(doc, TidyIndentContent) == TidyNoState
                 && node->next != NULL )
                TY_(PFlushLineSmart)( doc, indent );
        }
        else if ( nodeIsSTYLE(node) || nodeIsSCRIPT(node) )
        {
            PPrintScriptStyle( doc, (mode | PREFORMATTED | NOWRAP | CDATA),
                               indent, node );
        }
        else if ( TY_(nodeCMIsInline)(node) )
        {
            if ( cfgBool(doc, TidyMakeClean) )
            {
                /* replace <nobr>...</nobr> by &nbsp; or &#160; etc. */
                if ( nodeIsNOBR(node) )
                {
                    for ( content = node->content;
                          content != NULL;
                          content = content->next)
                        TY_(PPrintTree)( doc, mode|NOWRAP, indent, content );
                    return;
                }
            }

            /* otherwise a normal inline element */
            PPrintTag( doc, mode, indent, node );

            /* indent content for SELECT, TEXTAREA, MAP, OBJECT and APPLET */
            if ( ShouldIndent(doc, node) )
            {
                indent += spaces;
                PCondFlushLineSmart( doc, indent );

                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );

                indent -= spaces;
                PCondFlushLineSmart( doc, indent );
                /* PCondFlushLine( doc, indent ); */
            }
            else
            {
                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );
            }
            PPrintEndTag( doc, mode, indent, node );
        }
        else /* other tags */
        {
            Bool indcont  = ( cfgAutoBool(doc, TidyIndentContent) != TidyNoState );
            Bool indsmart = ( cfgAutoBool(doc, TidyIndentContent) == TidyAutoState );
            Bool hideend  = cfgBool( doc, TidyHideEndTags ) ||
              cfgBool( doc, TidyOmitOptionalTags );
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint contentIndent = indent;

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node && !nodeIsHTML(node))
            {
                TY_(PFlushLineSmart)( doc, indent );
            }

            if ( ShouldIndent(doc, node) )
                contentIndent += spaces;

            PCondFlushLineSmart( doc, indent );

            /*\
             *  Issue #180 - with the above PCondFlushLine, 
             *  this adds an uneccessary additional line!
             *  Maybe only if 'classic' ie --vertical-space yes 
            \*/
            if ( indsmart && node->prev != NULL && classic)
                TY_(PFlushLineSmart)( doc, indent );

            /* do not omit elements with attributes */
            if ( !hideend || !TY_(nodeHasCM)(node, CM_OMITST) ||
                 node->attributes != NULL )
            {
                PPrintTag( doc, mode, indent, node );

                if ( ShouldIndent(doc, node) )
                {
                    /* fix for bug 530791, don't wrap after */
                    /* <li> if first child is text node     */
                    if (!(nodeIsLI(node) && TY_(nodeIsText)(node->content)))
                        PCondFlushLineSmart( doc, contentIndent );
                }
                else if ( TY_(nodeHasCM)(node, CM_HTML) || nodeIsNOFRAMES(node) ||
                          (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node)) )
                    TY_(PFlushLineSmart)( doc, contentIndent );
            }
            else if ( ShouldIndent(doc, node) )
            {
                /*\
                 * Issue #180 - If the tag was NOT printed due to the -omit option,
                 * then reduce the bumped indent under the same ShouldIndent(doc, node) 
                 * conditions that caused the indent to be bumped.
                \*/
                contentIndent -= spaces;
            }

            last = NULL;
            for ( content = node->content; content; content = content->next )
            {
                /* kludge for naked text before block level tag */
                if ( last && !indcont && TY_(nodeIsText)(last) &&
                     content->tag && !TY_(nodeHasCM)(content, CM_INLINE) )
                {
                    /* TY_(PFlushLine)(fout, indent); */
                    TY_(PFlushLineSmart)( doc, contentIndent );
                }

                TY_(PPrintTree)( doc, mode, contentIndent, content );
                last = content;
            }

            /* don't flush line for td and th */
            if ( ShouldIndent(doc, node) ||
                 ( !hideend &&
                   ( TY_(nodeHasCM)(node, CM_HTML) || 
                     nodeIsNOFRAMES(node) ||
                     (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node))
                   )
                 )
               )
            {
                PCondFlushLineSmart( doc, indent );
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    PPrintEndTag( doc, mode, indent, node );
                    /* TY_(PFlushLine)( doc, indent ); */
                }
            }
            else
            {
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    /* newline before endtag for classic formatting */
                    if ( classic && !HasMixedContent(node) )
                        TY_(PFlushLineSmart)( doc, indent );
                    PPrintEndTag( doc, mode, indent, node );
                }
            }

            if (!indcont && !hideend && !nodeIsHTML(node) && !classic)
                TY_(PFlushLineSmart)( doc, indent );
            else if (classic && node->next != NULL && TY_(nodeHasCM)(node, CM_LIST|CM_DEFLIST|CM_TABLE|CM_BLOCK/*|CM_HEADING*/))
                TY_(PFlushLineSmart)( doc, indent );
        }
    }
}